

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

NodeList * __thiscall lunasvg::Element::children(NodeList *__return_storage_ptr__,Element *this)

{
  bool bVar1;
  SVGElement *this_00;
  SVGNodeList *this_01;
  pointer node;
  Node local_58;
  reference local_50;
  unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *child;
  const_iterator __end1;
  const_iterator __begin1;
  SVGNodeList *__range1;
  Element *this_local;
  NodeList *children;
  
  if ((this->super_Node).m_node == (SVGNode *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<lunasvg::Node,_std::allocator<lunasvg::Node>_>::vector(__return_storage_ptr__);
  }
  else {
    std::vector<lunasvg::Node,_std::allocator<lunasvg::Node>_>::vector(__return_storage_ptr__);
    this_00 = element(this,false);
    this_01 = SVGElement::children_abi_cxx11_(this_00);
    __end1 = std::__cxx11::
             list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
             ::begin(this_01);
    child = (unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_> *)
            std::__cxx11::
            list<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
            ::end(this_01);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&child), bVar1) {
      local_50 = std::
                 _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
                 ::operator*(&__end1);
      node = std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>::get
                       (local_50);
      Node::Node(&local_58,node);
      std::vector<lunasvg::Node,_std::allocator<lunasvg::Node>_>::push_back
                (__return_storage_ptr__,&local_58);
      std::
      _List_const_iterator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>
      ::operator++(&__end1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

NodeList Element::children() const
{
    if(m_node == nullptr)
        return NodeList();
    NodeList children;
    for(const auto& child : element()->children())
        children.push_back(child.get());
    return children;
}